

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_java.cpp
# Opt level: O2

Type * __thiscall
flatbuffers::java::JavaGenerator::DestinationType
          (Type *__return_storage_ptr__,JavaGenerator *this,Type *type,bool vectorelem)

{
  BaseType BVar1;
  StructDef *pSVar2;
  uint16_t uVar3;
  undefined6 uVar4;
  BaseType BVar5;
  Type local_28;
  
  BVar1 = type->base_type;
  if (BVar1 == BASE_TYPE_ARRAY) {
LAB_001b8167:
    if (vectorelem) {
      local_28.base_type = type->element;
      local_28.fixed_length = type->fixed_length;
      local_28.element = BASE_TYPE_NONE;
      local_28.struct_def = type->struct_def;
      local_28.enum_def = type->enum_def;
      DestinationType(__return_storage_ptr__,this,&local_28,true);
      return __return_storage_ptr__;
    }
LAB_001b8197:
    BVar1 = type->base_type;
    BVar5 = type->element;
    pSVar2 = type->struct_def;
    uVar3 = type->fixed_length;
    uVar4 = *(undefined6 *)&type->field_0x1a;
    __return_storage_ptr__->enum_def = type->enum_def;
    __return_storage_ptr__->fixed_length = uVar3;
    *(undefined6 *)&__return_storage_ptr__->field_0x1a = uVar4;
    __return_storage_ptr__->base_type = BVar1;
    __return_storage_ptr__->element = BVar5;
    __return_storage_ptr__->struct_def = pSVar2;
  }
  else {
    if (BVar1 == BASE_TYPE_USHORT) {
LAB_001b815f:
      __return_storage_ptr__->base_type = BASE_TYPE_INT;
    }
    else {
      if (BVar1 != BASE_TYPE_UINT) {
        if (BVar1 == BASE_TYPE_VECTOR) goto LAB_001b8167;
        if (BVar1 == BASE_TYPE_UCHAR) goto LAB_001b815f;
        goto LAB_001b8197;
      }
      __return_storage_ptr__->base_type = BASE_TYPE_LONG;
    }
    *(undefined8 *)&__return_storage_ptr__->element = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->struct_def + 4) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->enum_def + 2) = 0;
  }
  return __return_storage_ptr__;
}

Assistant:

Type DestinationType(const Type &type, bool vectorelem) const {
    switch (type.base_type) {
      // We use int for both uchar/ushort, since that generally means less
      // casting than using short for uchar.
      case BASE_TYPE_UCHAR: return Type(BASE_TYPE_INT);
      case BASE_TYPE_USHORT: return Type(BASE_TYPE_INT);
      case BASE_TYPE_UINT: return Type(BASE_TYPE_LONG);
      case BASE_TYPE_ARRAY:
      case BASE_TYPE_VECTOR:
        if (vectorelem) return DestinationType(type.VectorType(), vectorelem);
        FLATBUFFERS_FALLTHROUGH();  // else fall thru
      default: return type;
    }
  }